

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

void __thiscall Reader::processboundssec(Reader *this)

{
  _Rb_tree_header *p_Var1;
  ProcessedToken *pPVar2;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 aVar3;
  LpSectionKeyword LVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  ProcessedToken *pPVar7;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 *paVar8;
  invalid_argument *piVar9;
  _Base_ptr p_Var10;
  ProcessedToken *pPVar11;
  ProcessedToken *pPVar12;
  undefined1 *puVar13;
  ProcessedToken *pPVar14;
  ProcessedToken *pPVar15;
  shared_ptr<Variable> var;
  string name;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 local_80;
  undefined1 local_78 [24];
  key_type local_60;
  undefined4 uStack_5c;
  undefined1 local_50 [16];
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  p_Var5 = (this->sectiontokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->sectiontokens)._M_t._M_impl.super__Rb_tree_header;
    p_Var10 = &p_Var1->_M_header;
    do {
      if (3 < (int)p_Var5[1]._M_color) {
        p_Var10 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < 4];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var10 != p_Var1) && ((int)p_Var10[1]._M_color < 5)) {
      local_60 = BOUNDS;
      local_78._16_8_ = this;
      pmVar6 = std::
               map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
               ::operator[](&this->sectiontokens,&local_60);
      local_60 = BOUNDS;
      local_38._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
           ::operator[](&this->sectiontokens,&local_60);
      pPVar14 = (pmVar6->first)._M_current;
      pPVar11 = ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                  *)&(local_38._M_pi)->_M_use_count)->_M_current;
      if (pPVar14 != pPVar11) {
        local_78._16_8_ = local_78._16_8_ + 0x420;
        do {
          pPVar2 = pPVar14 + 1;
          pPVar7 = pPVar2;
          if (pPVar2 == pPVar11) {
LAB_001de10f:
            pPVar12 = pPVar7 + (pPVar7 != pPVar11);
            pPVar15 = pPVar12 + (pPVar12 != pPVar11);
            if ((((pPVar15 == pPVar11) || (pPVar14->type != CONST)) || (pPVar2->type != COMP)) ||
               (((pPVar7->type != VARID || (pPVar12->type != COMP)) || (pPVar15->type != CONST)))) {
              if (pPVar7 == pPVar11) {
LAB_001de36f:
                piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument
                          (piVar9,"File not existent or illegal file format.");
LAB_001de38b:
                __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
              if (pPVar14->type == VARID) {
                if ((pPVar2->type != COMP) || (pPVar7->type != CONST)) goto LAB_001de36f;
                local_80 = pPVar7->field_1;
                std::__cxx11::string::string
                          ((string *)&local_60,(pPVar14->field_1).name,(allocator *)local_78);
                Builder::getvarbyname((Builder *)local_78,(string *)local_78._16_8_);
                LVar4 = pPVar14[1].field_1.keyword;
                if ((LVar4 & ~OBJMAX) == OBJMIN) {
                  piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::invalid_argument::invalid_argument
                            (piVar9,"File not existent or illegal file format.");
LAB_001de42b:
                  __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                if (LVar4 != NONE) {
                  if (LVar4 == OBJMAX) goto LAB_001de2fc;
                  if (LVar4 != BOUNDS) {
                    piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::invalid_argument::invalid_argument
                              (piVar9,"File not existent or illegal file format.");
                    goto LAB_001de42b;
                  }
                  goto LAB_001de30c;
                }
LAB_001de312:
                paVar8 = (anon_union_8_5_ebd6940d_for_ProcessedToken_1 *)(local_78._0_8_ + 0x10);
              }
              else {
                if (((pPVar14->type != CONST) || (pPVar2->type != COMP)) || (pPVar7->type != VARID))
                goto LAB_001de36f;
                local_80 = pPVar14->field_1;
                std::__cxx11::string::string
                          ((string *)&local_60,(pPVar7->field_1).name,(allocator *)local_78);
                Builder::getvarbyname((Builder *)local_78,(string *)local_78._16_8_);
                LVar4 = pPVar14[1].field_1.keyword;
                if ((LVar4 & ~OBJMAX) == OBJMIN) {
                  piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::invalid_argument::invalid_argument
                            (piVar9,"File not existent or illegal file format.");
LAB_001de3f9:
                  __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                if (LVar4 != NONE) {
                  if (LVar4 != OBJMAX) {
                    if (LVar4 != BOUNDS) {
                      piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                      std::invalid_argument::invalid_argument
                                (piVar9,"File not existent or illegal file format.");
                      goto LAB_001de3f9;
                    }
                    goto LAB_001de312;
                  }
LAB_001de2fc:
                  *(anon_union_8_5_ebd6940d_for_ProcessedToken_1 *)(local_78._0_8_ + 0x10) =
                       local_80;
                }
LAB_001de30c:
                paVar8 = (anon_union_8_5_ebd6940d_for_ProcessedToken_1 *)(local_78._0_8_ + 8);
              }
              *paVar8 = local_80;
              (pmVar6->first)._M_current = pPVar12;
              goto LAB_001de328;
            }
            if (pPVar14[1].field_1.keyword != NONE) {
              piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (piVar9,"File not existent or illegal file format.");
              goto LAB_001de38b;
            }
            if ((pPVar12->field_1).keyword != NONE) {
              piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (piVar9,"File not existent or illegal file format.");
              goto LAB_001de38b;
            }
            aVar3 = pPVar14->field_1;
            local_40 = pPVar15->field_1;
            std::__cxx11::string::string
                      ((string *)&local_60,(pPVar7->field_1).name,(allocator *)local_78);
            Builder::getvarbyname((Builder *)local_78,(string *)local_78._16_8_);
            *(anon_union_8_5_ebd6940d_for_ProcessedToken_1 *)(local_78._0_8_ + 8) = aVar3;
            *(anon_union_8_5_ebd6940d_for_ProcessedToken_1 *)(local_78._0_8_ + 0x10) = local_40;
            (pmVar6->first)._M_current = pPVar15 + 1;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
            }
            puVar13 = (undefined1 *)CONCAT44(uStack_5c,local_60);
            if (puVar13 != local_50) goto LAB_001de346;
          }
          else {
            if ((pPVar14->type != VARID) || (pPVar2->type != FREE)) {
              pPVar7 = pPVar14 + 2;
              goto LAB_001de10f;
            }
            std::__cxx11::string::string
                      ((string *)&local_60,(pPVar14->field_1).name,(allocator *)local_78);
            Builder::getvarbyname((Builder *)local_78,(string *)local_78._16_8_);
            *(__node_base_ptr *)(local_78._0_8_ + 8) = (__node_base_ptr)&DAT_fff0000000000000;
            *(__node_base_ptr *)(local_78._0_8_ + 0x10) = (__node_base_ptr)&DAT_7ff0000000000000;
            (pmVar6->first)._M_current = pPVar14 + 2;
LAB_001de328:
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
            }
            puVar13 = (undefined1 *)CONCAT44(uStack_5c,local_60);
            if (puVar13 != local_50) {
LAB_001de346:
              operator_delete(puVar13);
            }
          }
          pPVar14 = (pmVar6->first)._M_current;
          pPVar11 = ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                      *)&(local_38._M_pi)->_M_use_count)->_M_current;
        } while (pPVar14 != pPVar11);
      }
    }
  }
  return;
}

Assistant:

void Reader::processboundssec() {
  if (!sectiontokens.count(LpSectionKeyword::BOUNDS)) return;
  std::vector<ProcessedToken>::iterator& begin(
      sectiontokens[LpSectionKeyword::BOUNDS].first);
  std::vector<ProcessedToken>::iterator& end(
      sectiontokens[LpSectionKeyword::BOUNDS].second);
  while (begin != end) {
    std::vector<ProcessedToken>::iterator next1 = begin;  // token after begin
    ++next1;

    // VAR free
    if (next1 != end && begin->type == ProcessedTokenType::VARID &&
        next1->type == ProcessedTokenType::FREE) {
      std::string name = begin->name;
      std::shared_ptr<Variable> var = builder.getvarbyname(name);
      var->lowerbound = -kHighsInf;
      var->upperbound = kHighsInf;
      begin = ++next1;
      continue;
    }

    std::vector<ProcessedToken>::iterator next2 =
        next1;  // token 2nd-after begin
    std::vector<ProcessedToken>::iterator next3 =
        next1;  // token 3rd-after begin
    std::vector<ProcessedToken>::iterator next4 =
        next1;  // token 4th-after begin
    if (next1 != end) {
      ++next2;
      ++next3;
      ++next4;
    }
    if (next2 != end) {
      ++next3;
      ++next4;
    }
    if (next3 != end) ++next4;

    // CONST COMP VAR COMP CONST
    if (next4 != end && begin->type == ProcessedTokenType::CONST &&
        next1->type == ProcessedTokenType::COMP &&
        next2->type == ProcessedTokenType::VARID &&
        next3->type == ProcessedTokenType::COMP &&
        next4->type == ProcessedTokenType::CONST) {
      lpassert(next1->dir == LpComparisonType::LEQ);
      lpassert(next3->dir == LpComparisonType::LEQ);

      double lb = begin->value;
      double ub = next4->value;

      std::string name = next2->name;
      std::shared_ptr<Variable> var = builder.getvarbyname(name);

      var->lowerbound = lb;
      var->upperbound = ub;

      begin = ++next4;
      continue;
    }

    // CONST COMP VAR
    if (next2 != end && begin->type == ProcessedTokenType::CONST &&
        next1->type == ProcessedTokenType::COMP &&
        next2->type == ProcessedTokenType::VARID) {
      double value = begin->value;
      std::string name = next2->name;
      std::shared_ptr<Variable> var = builder.getvarbyname(name);
      LpComparisonType dir = next1->dir;

      lpassert(dir != LpComparisonType::L && dir != LpComparisonType::G);

      switch (dir) {
        case LpComparisonType::LEQ:
          var->lowerbound = value;
          break;
        case LpComparisonType::GEQ:
          var->upperbound = value;
          break;
        case LpComparisonType::EQ:
          var->lowerbound = var->upperbound = value;
          break;
        default:
          lpassert(false);
      }
      begin = next3;
      continue;
    }

    // VAR COMP CONST
    if (next2 != end && begin->type == ProcessedTokenType::VARID &&
        next1->type == ProcessedTokenType::COMP &&
        next2->type == ProcessedTokenType::CONST) {
      double value = next2->value;
      std::string name = begin->name;
      std::shared_ptr<Variable> var = builder.getvarbyname(name);
      LpComparisonType dir = next1->dir;

      lpassert(dir != LpComparisonType::L && dir != LpComparisonType::G);

      switch (dir) {
        case LpComparisonType::LEQ:
          var->upperbound = value;
          break;
        case LpComparisonType::GEQ:
          var->lowerbound = value;
          break;
        case LpComparisonType::EQ:
          var->lowerbound = var->upperbound = value;
          break;
        default:
          lpassert(false);
      }
      begin = next3;
      continue;
    }

    lpassert(false);
  }
}